

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void paintSep(QPainter *p,QWidget *w,QRect *r,Orientation o,bool mouse_over)

{
  QPalette *pQVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QStyleOption opt;
  undefined1 local_78 [9];
  undefined1 uStack_6f;
  undefined6 uStack_6e;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 auStack_50 [16];
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  auStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff90 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)local_78,0,0);
  stack0xffffffffffffff90 =
       (undefined1 *)
       (CONCAT44((int)((ulong)stack0xffffffffffffff90 >> 0x20),~w->data->widget_attributes) &
       0xffffffff00000001);
  if (o != Horizontal) {
    stack0xffffffffffffff90 = (undefined1 *)((ulong)stack0xffffffffffffff90 | 0x80);
  }
  if (mouse_over) {
    stack0xffffffffffffff90 = CONCAT11(0x20,local_78[8]);
  }
  local_68._0_4_ = (r->x1).m_i;
  local_68._4_4_ = (r->y1).m_i;
  puStack_60._0_4_ = (r->x2).m_i;
  puStack_60._4_4_ = (r->y2).m_i;
  pQVar1 = QWidget::palette(w);
  QPalette::operator=((QPalette *)auStack_50,pQVar1);
  pQVar2 = QWidget::style(w);
  (**(code **)(*(long *)pQVar2 + 0xb0))(pQVar2,0x1b,local_78,p,w);
  QStyleOption::~QStyleOption((QStyleOption *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void paintSep(QPainter *p, QWidget *w, const QRect &r, Qt::Orientation o, bool mouse_over)
{
    QStyleOption opt(0);
    opt.state = QStyle::State_None;
    if (w->isEnabled())
        opt.state |= QStyle::State_Enabled;
    if (o != Qt::Horizontal)
        opt.state |= QStyle::State_Horizontal;
    if (mouse_over)
        opt.state |= QStyle::State_MouseOver;
    opt.rect = r;
    opt.palette = w->palette();

    w->style()->drawPrimitive(QStyle::PE_IndicatorDockWidgetResizeHandle, &opt, p, w);
}